

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall Highs::passModel(Highs *this,HighsModel *model)

{
  HighsModel *this_00;
  HighsSparseMatrix *this_01;
  HighsLogOptions *log_options;
  void **ppvVar1;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *pfVar2;
  pointer piVar3;
  pointer pdVar4;
  HessianFormat HVar5;
  HighsHessian *this_02;
  bool bVar6;
  HighsStatus HVar7;
  HighsInt HVar8;
  HighsStatus HVar9;
  string local_220;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *local_200;
  HighsStatus local_1f4;
  void **local_1f0;
  HighsHessian *local_1e8;
  HighsOptions *local_1e0;
  string local_1d8;
  HighsLogOptions local_1b8;
  HighsLogOptions local_158;
  HighsLogOptions local_f8;
  HighsLogOptions local_98;
  
  if ((this->written_log_header_ == false) &&
     (*(this->options_).super_HighsOptionsStruct.log_options.output_flag == true)) {
    highsLogHeader(&(this->options_).super_HighsOptionsStruct.log_options,
                   (this->options_).super_HighsOptionsStruct.log_githash);
    this->written_log_header_ = true;
  }
  if (((this->options_).super_HighsOptionsStruct.highs_analysis_level & 1) != 0) {
    analyseLp(&(this->options_).super_HighsOptionsStruct.log_options,&model->lp_);
  }
  this_00 = &this->model_;
  HighsModel::clear(this_00);
  std::vector<HighsLinearObjective,_std::allocator<HighsLinearObjective>_>::clear
            (&this->multi_linear_objective_);
  clearSolver(this);
  HighsLp::operator=(&this_00->lp_,&model->lp_);
  HVar5 = (model->hessian_).format_;
  (this->model_).hessian_.dim_ = (model->hessian_).dim_;
  (this->model_).hessian_.format_ = HVar5;
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&(this->model_).hessian_.start_,&(model->hessian_).start_);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&(this->model_).hessian_.index_,&(model->hessian_).index_);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&(this->model_).hessian_.value_,&(model->hessian_).value_);
  if (((this->model_).lp_.num_col_ == 0) || ((this->model_).lp_.num_row_ == 0)) {
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                 "Model has either no columns or no rows, so ignoring user constraint matrix data and initialising empty matrix\n"
                );
    (this->model_).lp_.a_matrix_.format_ = kColwise;
    local_220._M_dataplus._M_p = local_220._M_dataplus._M_p & 0xffffffff00000000;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (&(this->model_).lp_.a_matrix_.start_,(long)(this->model_).lp_.num_col_ + 1,
               (value_type_conflict2 *)&local_220);
    piVar3 = (this->model_).lp_.a_matrix_.index_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (*(pointer *)
         ((long)&(this->model_).lp_.a_matrix_.index_.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data + 8) != piVar3) {
      *(pointer *)
       ((long)&(this->model_).lp_.a_matrix_.index_.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data + 8) = piVar3;
    }
    pdVar4 = (this->model_).lp_.a_matrix_.value_.super__Vector_base<double,_std::allocator<double>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (*(pointer *)
         ((long)&(this->model_).lp_.a_matrix_.value_.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
         + 8) != pdVar4) {
      *(pointer *)
       ((long)&(this->model_).lp_.a_matrix_.value_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data +
       8) = pdVar4;
    }
  }
  else {
    this_01 = &(this->model_).lp_.a_matrix_;
    bVar6 = HighsSparseMatrix::isColwise(this_01);
    if ((!bVar6) && (bVar6 = HighsSparseMatrix::isRowwise(this_01), !bVar6)) {
      return kError;
    }
  }
  HighsLp::setMatrixDimensions(&this_00->lp_);
  HighsLp::resetScale(&this_00->lp_);
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"passModel","");
  log_options = &(this->options_).super_HighsOptionsStruct.log_options;
  bVar6 = lpDimensionsOk(&local_1d8,&this_00->lp_,log_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  HVar9 = kError;
  if ((bVar6) && ((this->model_).hessian_.format_ - kTriangular < 2)) {
    local_98.log_stream = log_options->log_stream;
    local_98.output_flag = (this->options_).super_HighsOptionsStruct.log_options.output_flag;
    local_98.log_to_console = (this->options_).super_HighsOptionsStruct.log_options.log_to_console;
    local_98.log_dev_level = (this->options_).super_HighsOptionsStruct.log_options.log_dev_level;
    local_98.user_log_callback =
         (this->options_).super_HighsOptionsStruct.log_options.user_log_callback;
    local_98.user_log_callback_data =
         (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data;
    pfVar2 = &local_98.user_callback;
    local_200 = &(this->options_).super_HighsOptionsStruct.log_options.user_callback;
    std::
    function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
    ::function(pfVar2,local_200);
    local_98.user_callback_active =
         (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
    local_98.user_callback_data =
         (this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
    local_1e0 = &this->options_;
    HVar7 = assessLp(&this_00->lp_,&this->options_);
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"assessLp","");
    HVar7 = interpretCallStatus(&local_98,HVar7,kOk,&local_220);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p);
    }
    if (local_98.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_98.user_callback.super__Function_base._M_manager)
                ((_Any_data *)pfVar2,(_Any_data *)pfVar2,__destroy_functor);
    }
    if (HVar7 != kError) {
      local_1e8 = &(this->model_).hessian_;
      ppvVar1 = &(this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
      local_1f4 = HVar7;
      HighsSparseMatrix::ensureColwise(&(this->model_).lp_.a_matrix_);
      local_1b8.log_stream = log_options->log_stream;
      local_1b8.output_flag = (this->options_).super_HighsOptionsStruct.log_options.output_flag;
      local_1b8.log_to_console =
           (this->options_).super_HighsOptionsStruct.log_options.log_to_console;
      local_1b8.log_dev_level = (this->options_).super_HighsOptionsStruct.log_options.log_dev_level;
      local_1b8.user_log_callback =
           (this->options_).super_HighsOptionsStruct.log_options.user_log_callback;
      local_1b8.user_log_callback_data =
           (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data;
      std::
      function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
      ::function(&local_1b8.user_callback,local_200);
      local_1b8.user_callback_active =
           (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
      local_1b8.user_callback_data = *ppvVar1;
      local_1f0 = ppvVar1;
      HVar7 = assessHessian(local_1e8,local_1e0);
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"assessHessian","");
      HVar7 = interpretCallStatus(&local_1b8,HVar7,local_1f4,&local_220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p);
      }
      if (local_1b8.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_1b8.user_callback.super__Function_base._M_manager)
                  ((_Any_data *)&local_1b8.user_callback,(_Any_data *)&local_1b8.user_callback,
                   __destroy_functor);
      }
      this_02 = local_1e8;
      if (HVar7 != kError) {
        if ((local_1e8->dim_ != 0) && (HVar8 = HighsHessian::numNz(local_1e8), HVar8 == 0)) {
          highsLogUser(log_options,kInfo,"Hessian has dimension %d but no nonzeros, so is ignored\n"
                       ,(ulong)(uint)this_02->dim_);
          HighsHessian::clear(this_02);
        }
        if (this_02->dim_ != 0) {
          completeHessian((this_00->lp_).num_col_,this_02);
        }
        local_f8.log_stream = log_options->log_stream;
        local_f8.output_flag = (this->options_).super_HighsOptionsStruct.log_options.output_flag;
        local_f8.log_to_console =
             (this->options_).super_HighsOptionsStruct.log_options.log_to_console;
        local_f8.log_dev_level = (this->options_).super_HighsOptionsStruct.log_options.log_dev_level
        ;
        local_f8.user_log_callback =
             (this->options_).super_HighsOptionsStruct.log_options.user_log_callback;
        local_f8.user_log_callback_data =
             (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data;
        pfVar2 = &local_f8.user_callback;
        std::
        function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
        ::function(pfVar2,local_200);
        local_f8.user_callback_active = *(bool *)(local_1f0 + 1);
        local_f8.user_callback_data = *local_1f0;
        HVar9 = clearSolver(this);
        local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"clearSolver","");
        HVar9 = interpretCallStatus(&local_f8,HVar9,HVar7,&local_220);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p);
        }
        if (local_f8.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_f8.user_callback.super__Function_base._M_manager)
                    ((_Any_data *)pfVar2,(_Any_data *)pfVar2,__destroy_functor);
        }
        local_158.log_stream = log_options->log_stream;
        local_158.output_flag = (this->options_).super_HighsOptionsStruct.log_options.output_flag;
        local_158.log_to_console =
             (this->options_).super_HighsOptionsStruct.log_options.log_to_console;
        local_158.log_dev_level =
             (this->options_).super_HighsOptionsStruct.log_options.log_dev_level;
        local_158.user_log_callback =
             (this->options_).super_HighsOptionsStruct.log_options.user_log_callback;
        local_158.user_log_callback_data =
             (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data;
        pfVar2 = &local_158.user_callback;
        std::
        function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
        ::function(pfVar2,local_200);
        local_158.user_callback_active = *(bool *)(local_1f0 + 1);
        local_158.user_callback_data = *local_1f0;
        HVar7 = optionChangeAction(this);
        local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_220,"optionChangeAction","");
        HVar9 = interpretCallStatus(&local_158,HVar7,HVar9,&local_220);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p);
        }
        if (local_158.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_158.user_callback.super__Function_base._M_manager)
                    ((_Any_data *)pfVar2,(_Any_data *)pfVar2,__destroy_functor);
        }
        HVar9 = returnFromHighs(this,HVar9);
      }
    }
  }
  return HVar9;
}

Assistant:

HighsStatus Highs::passModel(HighsModel model) {
  // This is the "master" Highs::passModel, in that all the others
  // (and readModel) eventually call it
  this->logHeader();
  // Possibly analyse the LP data
  if (kHighsAnalysisLevelModelData & options_.highs_analysis_level)
    analyseLp(options_.log_options, model.lp_);
  HighsStatus return_status = HighsStatus::kOk;
  // Clear the incumbent model and any associated data
  clearModel();
  HighsLp& lp = model_.lp_;
  HighsHessian& hessian = model_.hessian_;
  // Move the model's LP and Hessian to the internal LP and Hessian
  lp = std::move(model.lp_);
  hessian = std::move(model.hessian_);
  assert(lp.a_matrix_.formatOk());
  if (lp.num_col_ == 0 || lp.num_row_ == 0) {
    // Model constraint matrix has either no columns or no
    // rows. Clearly the matrix is empty, so may have no orientation
    // or starts assigned. HiGHS assumes that such a model will have
    // null starts, so make it column-wise
    highsLogUser(options_.log_options, HighsLogType::kInfo,
                 "Model has either no columns or no rows, so ignoring user "
                 "constraint matrix data and initialising empty matrix\n");
    lp.a_matrix_.format_ = MatrixFormat::kColwise;
    lp.a_matrix_.start_.assign(lp.num_col_ + 1, 0);
    lp.a_matrix_.index_.clear();
    lp.a_matrix_.value_.clear();
  } else {
    // Matrix has rows and columns, so a_matrix format must be valid
    if (!lp.a_matrix_.formatOk()) return HighsStatus::kError;
  }
  // Dimensions in a_matrix_ may not be set, so take them from lp.
  lp.setMatrixDimensions();
  // Residual scale factors may be present. ToDo Allow user-defined
  // scale factors to be passed
  assert(!lp.is_scaled_);
  assert(!lp.is_moved_);
  lp.resetScale();
  // Check that the LP array dimensions are valid
  if (!lpDimensionsOk("passModel", lp, options_.log_options))
    return HighsStatus::kError;
  // Check that the Hessian format is valid
  if (!hessian.formatOk()) return HighsStatus::kError;
  // Check validity of the LP, normalising its values
  return_status = interpretCallStatus(
      options_.log_options, assessLp(lp, options_), return_status, "assessLp");
  if (return_status == HighsStatus::kError) return return_status;
  // Now legality of matrix is established, ensure that it is
  // column-wise
  lp.ensureColwise();
  // Check validity of any Hessian, normalising its entries
  return_status = interpretCallStatus(options_.log_options,
                                      assessHessian(hessian, options_),
                                      return_status, "assessHessian");
  if (return_status == HighsStatus::kError) return return_status;
  if (hessian.dim_) {
    // Clear any zero Hessian
    if (hessian.numNz() == 0) {
      highsLogUser(options_.log_options, HighsLogType::kInfo,
                   "Hessian has dimension %" HIGHSINT_FORMAT
                   " but no nonzeros, so is ignored\n",
                   hessian.dim_);
      hessian.clear();
    }
  }
  // Ensure that any non-zero Hessian of dimension less than the
  // number of columns in the model is completed
  if (hessian.dim_) completeHessian(this->model_.lp_.num_col_, hessian);
  // Clear solver status, solution, basis and info associated with any
  // previous model; clear any HiGHS model object; create a HiGHS
  // model object for this LP
  return_status = interpretCallStatus(options_.log_options, clearSolver(),
                                      return_status, "clearSolver");
  // Apply any user scaling in call to optionChangeAction
  return_status =
      interpretCallStatus(options_.log_options, optionChangeAction(),
                          return_status, "optionChangeAction");
  return returnFromHighs(return_status);
}